

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O2

void __thiscall llvm::DWARFDebugLoc::parse(DWARFDebugLoc *this,DWARFDataExtractor *data)

{
  Twine ErrorBanner;
  undefined1 uVar1;
  raw_ostream *OS;
  storage_type *Elt;
  undefined1 local_c8 [8];
  Expected<llvm::DWARFDebugLoc::LocationList> LL;
  undefined8 uStack_50;
  undefined8 local_48;
  uint64_t local_40;
  uint64_t Offset;
  
  this->IsLittleEndian = (data->super_DataExtractor).IsLittleEndian != '\0';
  this->AddressSize = (uint)(data->super_DataExtractor).AddressSize;
  local_40 = 0;
  do {
    if ((data->super_DataExtractor).Data.Length <= local_40) {
      return;
    }
    parseOneLocationList
              ((Expected<llvm::DWARFDebugLoc::LocationList> *)local_c8,this,data,&local_40);
    uVar1 = LL.field_0.TStorage.buffer[0x60];
    if ((LL.field_0.TStorage.buffer[0x60] & 1U) == 0) {
      Elt = Expected<llvm::DWARFDebugLoc::LocationList>::getStorage
                      ((Expected<llvm::DWARFDebugLoc::LocationList> *)local_c8);
      SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>::push_back
                ((SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false> *)this,Elt);
    }
    else {
      Expected<llvm::DWARFDebugLoc::LocationList>::takeError
                ((Expected<llvm::DWARFDebugLoc::LocationList> *)&Offset);
      OS = WithColor::error();
      Twine::Twine((Twine *)&LL.field_0x68);
      ErrorBanner.RHS = (Child)uStack_50;
      ErrorBanner.LHS = (Child)LL._104_8_;
      ErrorBanner._16_8_ = local_48;
      logAllUnhandledErrors((Error *)&Offset,OS,ErrorBanner);
      if ((long *)(Offset & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)(Offset & 0xfffffffffffffffe) + 8))();
      }
    }
    Expected<llvm::DWARFDebugLoc::LocationList>::~Expected
              ((Expected<llvm::DWARFDebugLoc::LocationList> *)local_c8);
  } while ((uVar1 & 1) == 0);
  return;
}

Assistant:

void DWARFDebugLoc::parse(const DWARFDataExtractor &data) {
  IsLittleEndian = data.isLittleEndian();
  AddressSize = data.getAddressSize();

  uint64_t Offset = 0;
  while (Offset < data.getData().size()) {
    if (auto LL = parseOneLocationList(data, &Offset))
      Locations.push_back(std::move(*LL));
    else {
      logAllUnhandledErrors(LL.takeError(), WithColor::error());
      break;
    }
  }
}